

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void test1<nrg::AsyncExecutor<nrg::PrioExecution>>(char *title)

{
  pointer pcVar1;
  char *pcVar2;
  int iVar3;
  long *plVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  ostream *poVar6;
  size_type *psVar7;
  int iVar8;
  int i;
  Executor<nrg::AsyncExecutor<nrg::PrioExecution>_> ex;
  optional<int> result;
  AsyncResult<int> ar1;
  AsyncResult<int> ar2;
  optional<int> res3;
  AsyncResult<int> ar4;
  AsyncResult<int> ar3;
  int local_10c;
  Executor<nrg::AsyncExecutor<nrg::PrioExecution>_> local_108;
  undefined1 local_f8 [40];
  long *local_d0;
  long local_c8;
  long local_c0 [2];
  AsyncResult<int> local_b0;
  AsyncResult<int> local_a0;
  undefined1 local_90 [24];
  AsyncResult<int> local_78;
  char *local_68;
  reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_> local_60;
  ExceptionHandler local_58;
  
  local_58.super__Function_base._M_functor._8_8_ = 0;
  local_58.super__Function_base._M_functor._M_unused._M_object = onError;
  local_58._M_invoker =
       std::_Function_handler<void_(const_std::exception_&),_void_(*)(const_std::exception_&)>::
       _M_invoke;
  local_58.super__Function_base._M_manager =
       std::_Function_handler<void_(const_std::exception_&),_void_(*)(const_std::exception_&)>::
       _M_manager;
  nrg::Executor<nrg::AsyncExecutor<nrg::PrioExecution>_>::Executor(&local_108,&local_58);
  if (local_58.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_58.super__Function_base._M_manager)
              ((_Any_data *)&local_58,(_Any_data *)&local_58,__destroy_functor);
  }
  local_10c = 0x2a;
  local_b0.impl_.super___shared_ptr<nrg::AsyncResult<int>::Impl,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)&std::cerr;
  local_d0 = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0," -> start","");
  strlen(title);
  plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,(ulong)title);
  psVar7 = (size_type *)(plVar4 + 2);
  if ((size_type *)*plVar4 == psVar7) {
    local_f8._16_8_ = *psVar7;
    local_f8._24_8_ = plVar4[3];
    local_f8._0_8_ = local_f8 + 0x10;
  }
  else {
    local_f8._16_8_ = *psVar7;
    local_f8._0_8_ = (size_type *)*plVar4;
  }
  local_f8._8_8_ = plVar4[1];
  *plVar4 = (long)psVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  nrg::detail::AsyncQueue<nrg::PrioExecution>::operator()
            (local_108.executor_.impl_.
             super___shared_ptr<nrg::detail::AsyncQueue<nrg::PrioExecution>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr,print<std::__cxx11::string>,
             (reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_> *)&local_b0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8);
  if ((undefined1 *)local_f8._0_8_ != local_f8 + 0x10) {
    operator_delete((void *)local_f8._0_8_,local_f8._16_8_ + 1);
  }
  if (local_d0 != local_c0) {
    operator_delete(local_d0,local_c0[0] + 1);
  }
  local_10c = local_10c + 1;
  nrg::detail::AsyncQueue<nrg::PrioExecution>::operator()
            (local_108.executor_.impl_.
             super___shared_ptr<nrg::detail::AsyncQueue<nrg::PrioExecution>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr,print2,&local_10c,(char (*) [7])"hallo1");
  local_10c = local_10c + 1;
  nrg::detail::AsyncQueue<nrg::PrioExecution>::operator()
            (local_108.executor_.impl_.
             super___shared_ptr<nrg::detail::AsyncQueue<nrg::PrioExecution>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr,print2,&local_10c,(char (*) [7])"hallo2");
  local_10c = local_10c + 1;
  nrg::detail::AsyncQueue<nrg::PrioExecution>::operator()
            (local_108.executor_.impl_.
             super___shared_ptr<nrg::detail::AsyncQueue<nrg::PrioExecution>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr,print2,&local_10c,(char (*) [7])"hallo3");
  local_10c = local_10c + 1;
  nrg::detail::AsyncQueue<nrg::PrioExecution>::operator()
            (local_108.executor_.impl_.
             super___shared_ptr<nrg::detail::AsyncQueue<nrg::PrioExecution>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr,print2,&local_10c,(char (*) [7])"hallo4");
  local_10c = local_10c + 1;
  nrg::detail::AsyncQueue<nrg::PrioExecution>::operator()
            (local_108.executor_.impl_.
             super___shared_ptr<nrg::detail::AsyncQueue<nrg::PrioExecution>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr,print2,&local_10c,(char (*) [7])"hallo5");
  local_10c = local_10c + 1;
  nrg::detail::AsyncQueue<nrg::PrioExecution>::operator()
            (local_108.executor_.impl_.
             super___shared_ptr<nrg::detail::AsyncQueue<nrg::PrioExecution>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr,print2,&local_10c,(char (*) [7])"hallo6");
  nrg::detail::AsyncQueue<nrg::PrioExecution>::operator()
            (local_108.executor_.impl_.
             super___shared_ptr<nrg::detail::AsyncQueue<nrg::PrioExecution>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr,exception);
  local_b0.impl_.super___shared_ptr<nrg::AsyncResult<int>::Impl,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x70);
  p_Var5->_M_use_count = 1;
  p_Var5->_M_weak_count = 1;
  p_Var5->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0012ea90;
  p_Var5[1]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var5[1]._M_use_count = 0;
  p_Var5[1]._M_weak_count = 0;
  p_Var5[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var5[2]._M_use_count = 0;
  p_Var5[2]._M_weak_count = 0;
  p_Var5[3]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var5[3]._M_use_count = 0;
  p_Var5[3]._M_weak_count = 0;
  p_Var5[4]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var5[4]._M_use_count = 0;
  p_Var5[4]._M_weak_count = 0;
  p_Var5[5]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var5[5]._M_use_count = 0;
  p_Var5[5]._M_weak_count = 0;
  p_Var5[6]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var5[6]._M_use_count = 0;
  p_Var5[6]._M_weak_count = 0;
  std::condition_variable::condition_variable((condition_variable *)&p_Var5[3]._M_use_count);
  *(undefined1 *)&p_Var5[6]._M_weak_count = 0;
  local_a0.impl_.super___shared_ptr<nrg::AsyncResult<int>::Impl,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  local_b0.impl_.super___shared_ptr<nrg::AsyncResult<int>::Impl,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (Impl *)(p_Var5 + 1);
  local_b0.impl_.super___shared_ptr<nrg::AsyncResult<int>::Impl,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var5;
  p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x70);
  p_Var5->_M_use_count = 1;
  p_Var5->_M_weak_count = 1;
  p_Var5->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0012ea90;
  p_Var5[1]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var5[1]._M_use_count = 0;
  p_Var5[1]._M_weak_count = 0;
  p_Var5[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var5[2]._M_use_count = 0;
  p_Var5[2]._M_weak_count = 0;
  p_Var5[3]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var5[3]._M_use_count = 0;
  p_Var5[3]._M_weak_count = 0;
  p_Var5[4]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var5[4]._M_use_count = 0;
  p_Var5[4]._M_weak_count = 0;
  p_Var5[5]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var5[5]._M_use_count = 0;
  p_Var5[5]._M_weak_count = 0;
  p_Var5[6]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var5[6]._M_use_count = 0;
  p_Var5[6]._M_weak_count = 0;
  std::condition_variable::condition_variable((condition_variable *)&p_Var5[3]._M_use_count);
  *(undefined1 *)&p_Var5[6]._M_weak_count = 0;
  local_78.impl_.super___shared_ptr<nrg::AsyncResult<int>::Impl,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  local_a0.impl_.super___shared_ptr<nrg::AsyncResult<int>::Impl,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)(p_Var5 + 1);
  local_a0.impl_.super___shared_ptr<nrg::AsyncResult<int>::Impl,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var5;
  p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x70);
  p_Var5->_M_use_count = 1;
  p_Var5->_M_weak_count = 1;
  p_Var5->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0012ea90;
  p_Var5[1]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var5[1]._M_use_count = 0;
  p_Var5[1]._M_weak_count = 0;
  p_Var5[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var5[2]._M_use_count = 0;
  p_Var5[2]._M_weak_count = 0;
  p_Var5[3]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var5[3]._M_use_count = 0;
  p_Var5[3]._M_weak_count = 0;
  p_Var5[4]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var5[4]._M_use_count = 0;
  p_Var5[4]._M_weak_count = 0;
  p_Var5[5]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var5[5]._M_use_count = 0;
  p_Var5[5]._M_weak_count = 0;
  p_Var5[6]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var5[6]._M_use_count = 0;
  p_Var5[6]._M_weak_count = 0;
  std::condition_variable::condition_variable((condition_variable *)&p_Var5[3]._M_use_count);
  *(undefined1 *)&p_Var5[6]._M_weak_count = 0;
  local_f8._0_4_ = 0x2a;
  local_78.impl_.super___shared_ptr<nrg::AsyncResult<int>::Impl,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)(p_Var5 + 1);
  local_78.impl_.super___shared_ptr<nrg::AsyncResult<int>::Impl,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var5;
  nrg::detail::AsyncQueue<nrg::PrioExecution>::operator()
            (local_108.executor_.impl_.
             super___shared_ptr<nrg::detail::AsyncQueue<nrg::PrioExecution>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr,withResult,&local_b0,&local_a0,&local_78,(int *)local_f8);
  iVar3 = nrg::AsyncResult<int>::Impl::getResult
                    (local_b0.impl_.
                     super___shared_ptr<nrg::AsyncResult<int>::Impl,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
  local_d0 = (long *)0x0;
  local_68 = title;
  nrg::AsyncResult<int>::Impl::getResult<long,std::ratio<1l,1000l>>
            ((Impl *)local_f8,
             (duration<long,_std::ratio<1L,_1000L>_> *)
             local_a0.impl_.
             super___shared_ptr<nrg::AsyncResult<int>::Impl,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  iVar8 = 0x2b;
  if (local_f8[4] != '\0') {
    iVar8 = local_f8._0_4_;
  }
  local_f8._0_8_ = (pointer)0x0;
  nrg::AsyncResult<int>::Impl::getResult<long,std::ratio<1l,1000l>>
            ((Impl *)local_90,
             (duration<long,_std::ratio<1L,_1000L>_> *)
             local_78.impl_.
             super___shared_ptr<nrg::AsyncResult<int>::Impl,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"ar1: ",5);
  poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,",  ar2: ",8);
  poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,iVar8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,",  res3: ",9);
  iVar8 = 0;
  if (local_90[4] != '\0') {
    iVar8 = local_90._0_4_;
  }
  poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,iVar8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
  std::chrono::_V2::steady_clock::now();
  local_90._8_8_ = 0;
  p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x70);
  p_Var5->_M_use_count = 1;
  p_Var5->_M_weak_count = 1;
  p_Var5->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0012ea90;
  p_Var5[1]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var5[1]._M_use_count = 0;
  p_Var5[1]._M_weak_count = 0;
  p_Var5[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var5[2]._M_use_count = 0;
  p_Var5[2]._M_weak_count = 0;
  p_Var5[3]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var5[3]._M_use_count = 0;
  p_Var5[3]._M_weak_count = 0;
  p_Var5[4]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var5[4]._M_use_count = 0;
  p_Var5[4]._M_weak_count = 0;
  p_Var5[5]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var5[5]._M_use_count = 0;
  p_Var5[5]._M_weak_count = 0;
  p_Var5[6]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var5[6]._M_use_count = 0;
  p_Var5[6]._M_weak_count = 0;
  std::condition_variable::condition_variable((condition_variable *)&p_Var5[3]._M_use_count);
  *(undefined1 *)&p_Var5[6]._M_weak_count = 0;
  local_90._8_8_ = p_Var5 + 1;
  local_90._16_8_ = p_Var5;
  nrg::detail::AsyncQueue<nrg::PrioExecution>::operator()
            (local_108.executor_.impl_.
             super___shared_ptr<nrg::detail::AsyncQueue<nrg::PrioExecution>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr,roundTrip,(AsyncResult<int> *)(local_90 + 8));
  local_d0 = (long *)0xc8;
  nrg::AsyncResult<int>::Impl::getResult<long,std::ratio<1l,1000l>>
            ((Impl *)local_f8,(duration<long,_std::ratio<1L,_1000L>_> *)local_90._8_8_);
  std::chrono::_V2::steady_clock::now();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ar4 duration: ",0xe);
  poVar6 = std::ostream::_M_insert<long>((long)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," ns\n",4);
  local_f8._0_8_ = &std::cerr;
  local_d0._0_1_ = (condition_variable)0xfb;
  local_d0._1_3_ = 0;
  nrg::detail::AsyncQueue<nrg::PrioExecution>::operator()
            (local_108.executor_.impl_.
             super___shared_ptr<nrg::detail::AsyncQueue<nrg::PrioExecution>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr,print<int>,
             (reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_> *)local_f8,
             (int *)&local_d0);
  pcVar1 = local_f8 + 0x10;
  local_f8._0_8_ = &std::cerr;
  local_d0._0_1_ = (condition_variable)0xfc;
  local_d0._1_3_ = 0;
  nrg::detail::AsyncQueue<nrg::PrioExecution>::operator()
            (local_108.executor_.impl_.
             super___shared_ptr<nrg::detail::AsyncQueue<nrg::PrioExecution>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr,print<int>,
             (reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_> *)local_f8,
             (int *)&local_d0);
  local_f8._0_8_ = &std::cerr;
  local_d0._0_1_ = (condition_variable)0xfd;
  local_d0._1_3_ = 0;
  nrg::detail::AsyncQueue<nrg::PrioExecution>::operator()
            (local_108.executor_.impl_.
             super___shared_ptr<nrg::detail::AsyncQueue<nrg::PrioExecution>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr,print<int>,
             (reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_> *)local_f8,
             (int *)&local_d0);
  local_f8._0_8_ = &std::cerr;
  local_d0._0_1_ = (condition_variable)0xfe;
  local_d0._1_3_ = 0;
  nrg::detail::AsyncQueue<nrg::PrioExecution>::operator()
            (local_108.executor_.impl_.
             super___shared_ptr<nrg::detail::AsyncQueue<nrg::PrioExecution>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr,print<int>,
             (reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_> *)local_f8,
             (int *)&local_d0);
  local_f8._0_8_ = &std::cerr;
  local_d0._0_1_ = (condition_variable)0xff;
  local_d0._1_3_ = 0;
  nrg::detail::AsyncQueue<nrg::PrioExecution>::operator()
            (local_108.executor_.impl_.
             super___shared_ptr<nrg::detail::AsyncQueue<nrg::PrioExecution>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr,print<int>,
             (reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_> *)local_f8,
             (int *)&local_d0);
  local_f8._0_8_ = &std::cerr;
  local_d0 = (long *)CONCAT44(local_d0._4_4_,0x100);
  nrg::detail::AsyncQueue<nrg::PrioExecution>::operator()
            (local_108.executor_.impl_.
             super___shared_ptr<nrg::detail::AsyncQueue<nrg::PrioExecution>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr,print<int>,
             (reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_> *)local_f8,
             (int *)&local_d0);
  local_d0 = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"no timeout","");
  local_f8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char*>((string *)local_f8,local_d0,local_c8 + (long)local_d0);
  local_f8._32_8_ = std::chrono::_V2::steady_clock::now();
  nrg::detail::AsyncQueue<nrg::PrioExecution>::operator()
            (local_108.executor_.impl_.
             super___shared_ptr<nrg::detail::AsyncQueue<nrg::PrioExecution>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr,(TimedCaller *)local_f8);
  if ((pointer)local_f8._0_8_ != pcVar1) {
    operator_delete((void *)local_f8._0_8_,local_f8._16_8_ + 1);
  }
  if (local_d0 != local_c0) {
    operator_delete(local_d0,local_c0[0] + 1);
  }
  local_60._M_data = (basic_ostream<char,_std::char_traits<char>_> *)&std::cerr;
  local_d0 = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0," -> done\n","");
  pcVar2 = local_68;
  strlen(local_68);
  plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,(ulong)pcVar2);
  psVar7 = (size_type *)(plVar4 + 2);
  if ((size_type *)*plVar4 == psVar7) {
    local_f8._16_8_ = *psVar7;
    local_f8._24_8_ = plVar4[3];
    local_f8._0_8_ = pcVar1;
  }
  else {
    local_f8._16_8_ = *psVar7;
    local_f8._0_8_ = (size_type *)*plVar4;
  }
  local_f8._8_8_ = plVar4[1];
  *plVar4 = (long)psVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  nrg::detail::AsyncQueue<nrg::PrioExecution>::operator()
            (local_108.executor_.impl_.
             super___shared_ptr<nrg::detail::AsyncQueue<nrg::PrioExecution>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr,print<std::__cxx11::string>,&local_60,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8);
  if ((pointer)local_f8._0_8_ != pcVar1) {
    operator_delete((void *)local_f8._0_8_,local_f8._16_8_ + 1);
  }
  if (local_d0 != local_c0) {
    operator_delete(local_d0,local_c0[0] + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90._16_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90._16_8_);
  }
  if (local_78.impl_.super___shared_ptr<nrg::AsyncResult<int>::Impl,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.impl_.
               super___shared_ptr<nrg::AsyncResult<int>::Impl,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_a0.impl_.super___shared_ptr<nrg::AsyncResult<int>::Impl,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a0.impl_.
               super___shared_ptr<nrg::AsyncResult<int>::Impl,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_b0.impl_.super___shared_ptr<nrg::AsyncResult<int>::Impl,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b0.impl_.
               super___shared_ptr<nrg::AsyncResult<int>::Impl,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_108.executor_.impl_.
      super___shared_ptr<nrg::detail::AsyncQueue<nrg::PrioExecution>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_108.executor_.impl_.
               super___shared_ptr<nrg::detail::AsyncQueue<nrg::PrioExecution>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

void test1(const char* title)
{
    nrg::Executor<ExecutionMode> ex(onError);
    int i = 42;
    ex(print<std::string>, std::ref(std::cerr), title + std::string(" -> start"));
    ex(print2, ++i, "hallo1");
    ex(print2, ++i, "hallo2");
    ex(print2, ++i, "hallo3");
    ex(print2, ++i, "hallo4");
    ex(print2, ++i, "hallo5");
    ex(print2, ++i, "hallo6");

    ex(exception);

    nrg::AsyncResult<int> ar1;
    nrg::AsyncResult<int> ar2;
    nrg::AsyncResult<int> ar3;

    ex(withResult, ar1, ar2, ar3, 42);
    int res1 = ar1.getResult();
    int res2 = ar2.getResult(std::chrono::milliseconds(0), 43);
    std::experimental::optional<int> res3 = ar3.getResult(std::chrono::milliseconds(0));
    std::cerr <<  "ar1: " <<  res1 << ",  ar2: " << res2 << ",  res3: " << (res3 ? *res3 : 0) << "\n";

    auto t1 = now();

    nrg::AsyncResult<int> ar4;
    ex(roundTrip, ar4);
    ar4.getResult(std::chrono::milliseconds(200), 99);
    auto dur = now()-t1;
    std::cout <<  "ar4 duration: " << std::chrono::duration_cast<std::chrono::nanoseconds>(dur).count() << " ns\n";

    ex(print<int>, std::ref(std::cerr), 251);
    ex(print<int>, std::ref(std::cerr), 252);
    ex(print<int>, std::ref(std::cerr), 253);
    ex(print<int>, std::ref(std::cerr), 254);
    ex(print<int>, std::ref(std::cerr), 255);
    ex(print<int>, std::ref(std::cerr), 256);
    ex(TimedCaller("no timeout"));
    ex(print<std::string>, std::ref(std::cerr), title + std::string(" -> done\n"));

    //std::this_thread::sleep_for(std::chrono::milliseconds(1000));
}